

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::IArrayBox>::FabArray(FabArray<amrex::IArrayBox> *this,Arena *a)

{
  FabArrayStats *in_RSI;
  undefined8 *in_RDI;
  FabArrayBase *unaff_retaddr;
  
  FabArrayBase::FabArrayBase(unaff_retaddr);
  *in_RDI = &PTR__FabArray_01802ea0;
  std::
  unique_ptr<amrex::FabFactory<amrex::IArrayBox>,std::default_delete<amrex::FabFactory<amrex::IArrayBox>>>
  ::unique_ptr<std::default_delete<amrex::FabFactory<amrex::IArrayBox>>,void>
            ((unique_ptr<amrex::FabFactory<amrex::IArrayBox>,_std::default_delete<amrex::FabFactory<amrex::IArrayBox>_>_>
              *)in_RSI);
  DataAllocator::DataAllocator((DataAllocator *)(in_RDI + 0x1f),(Arena *)in_RSI);
  *(undefined1 *)(in_RDI + 0x20) = 0;
  std::vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_>::vector
            ((vector<amrex::IArrayBox_*,_std::allocator<amrex::IArrayBox_*>_> *)0xffb7b8);
  in_RDI[0x24] = 0;
  MultiArray4<int>::MultiArray4((MultiArray4<int> *)(in_RDI + 0x25));
  MultiArray4<const_int>::MultiArray4((MultiArray4<const_int> *)(in_RDI + 0x26));
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xffb7f3);
  ShMem::ShMem((ShMem *)(in_RDI + 0x2a));
  std::
  unique_ptr<amrex::FBData<amrex::IArrayBox>,std::default_delete<amrex::FBData<amrex::IArrayBox>>>::
  unique_ptr<std::default_delete<amrex::FBData<amrex::IArrayBox>>,void>
            ((unique_ptr<amrex::FBData<amrex::IArrayBox>,_std::default_delete<amrex::FBData<amrex::IArrayBox>_>_>
              *)in_RSI);
  std::
  unique_ptr<amrex::PCData<amrex::IArrayBox>,std::default_delete<amrex::PCData<amrex::IArrayBox>>>::
  unique_ptr<std::default_delete<amrex::PCData<amrex::IArrayBox>>,void>
            ((unique_ptr<amrex::PCData<amrex::IArrayBox>,_std::default_delete<amrex::PCData<amrex::IArrayBox>_>_>
              *)in_RSI);
  std::
  unique_ptr<amrex::FabArray<amrex::IArrayBox>,std::default_delete<amrex::FabArray<amrex::IArrayBox>>>
  ::unique_ptr<std::default_delete<amrex::FabArray<amrex::IArrayBox>>,void>
            ((unique_ptr<amrex::FabArray<amrex::IArrayBox>,_std::default_delete<amrex::FabArray<amrex::IArrayBox>_>_>
              *)in_RSI);
  FabArrayBase::FabArrayStats::recordBuild(in_RSI);
  return;
}

Assistant:

FabArray<FAB>::FabArray (Arena* a) noexcept
    : m_dallocator(a),
      shmem()
{
    m_FA_stats.recordBuild();
}